

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forced_return.hpp
# Opt level: O0

ref_attribute * boost::detail::variant::forced_return<spartsi::ref_attribute*>(void)

{
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/spartanPAGE[P]spartsi/external/boost/variant/include/boost/variant/detail/forced_return.hpp"
                ,0x2f,"T boost::detail::variant::forced_return() [T = spartsi::ref_attribute *]");
}

Assistant:

forced_return()
{
    // logical error: should never be here! (see above)
    BOOST_ASSERT(false);

    forced_return_no_return();

#ifdef BOOST_NO_NORETURN
    BOOST_VARIANT_AUX_GENERIC_RESULT_TYPE(T) (*dummy)() = 0;
    return dummy();
#endif
}